

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O3

void __thiscall cmDynamicLoaderCache::FlushCache(cmDynamicLoaderCache *this)

{
  _Rb_tree_node_base *p_Var1;
  cmDynamicLoaderCache *this_00;
  _Self __tmp;
  
  p_Var1 = (this->CacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = Instance;
  while (Instance = this_00,
        (_Rb_tree_header *)p_Var1 != &(this->CacheMap)._M_t._M_impl.super__Rb_tree_header) {
    cmsys::DynamicLoader::CloseLibrary(*(LibraryHandle *)(p_Var1 + 2));
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    this_00 = Instance;
  }
  if (this_00 != (cmDynamicLoaderCache *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                 *)this_00);
  }
  operator_delete(this_00,0x30);
  Instance = (cmDynamicLoaderCache *)0x0;
  return;
}

Assistant:

void cmDynamicLoaderCache::FlushCache()
{
  for (std::map<std::string, cmsys::DynamicLoader::LibraryHandle>::iterator
         it = this->CacheMap.begin();
       it != this->CacheMap.end(); it++) {
    cmsys::DynamicLoader::CloseLibrary(it->second);
  }
  delete cmDynamicLoaderCache::Instance;
  cmDynamicLoaderCache::Instance = CM_NULLPTR;
}